

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O1

void __thiscall Arcflow::finalize(Arcflow *this)

{
  NodeSet *this_00;
  pointer *ppAVar1;
  vector<int,std::allocator<int>> *this_01;
  iterator iVar2;
  pointer pvVar3;
  int *piVar4;
  pointer piVar5;
  iterator iVar6;
  pointer pvVar7;
  int *piVar8;
  pointer pAVar9;
  pointer pIVar10;
  byte bVar11;
  int *piVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  int iVar13;
  int iVar14;
  iterator __end1;
  ulong uVar15;
  runtime_error *this_02;
  iterator __begin1;
  pointer piVar16;
  ulong uVar17;
  pointer pAVar18;
  size_t sVar19;
  void *__s2;
  int *piVar20;
  int *piVar21;
  ulong uVar22;
  ulong uVar23;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  long lVar24;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  size_t __n;
  iterator __begin3;
  uint uVar25;
  long lVar26;
  bool bVar27;
  vector<int,_std::allocator<int>_> torder;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  bigger_than;
  char _error_msg_ [256];
  ulong local_1b8;
  Arc local_1a4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_198;
  iterator iStack_190;
  int *local_188;
  vector<int,_std::allocator<int>_> local_178;
  void *local_160;
  pointer local_158;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_150;
  vector<bool,_std::allocator<bool>_> local_138 [6];
  
  if (this->ready != false) {
    snprintf((char *)local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x1b9);
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,(char *)local_138);
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar13 = (this->inst).nbtypes;
  this->S = 0;
  if (iVar13 == 1) {
    this_00 = &this->NS;
    iVar13 = NodeSet::size(this_00);
    local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)
         CONCAT44(local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,iVar13);
    std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)&this->Ts,local_138);
    local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = this->LOSS;
    local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)
         CONCAT44(this->S,*(this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start);
    iVar2._M_current =
         (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar2._M_current ==
        (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<Arc,_std::allocator<Arc>_>::_M_realloc_insert<Arc>
                (&this->A,iVar2,(Arc *)local_138);
    }
    else {
      (iVar2._M_current)->label =
           local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_offset;
      *(_Bit_type **)iVar2._M_current =
           local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
      ppAVar1 = &(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    iVar13 = NodeSet::size(this_00);
    if (1 < iVar13) {
      iVar13 = 1;
      do {
        local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = this->LOSS;
        local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p =
             (_Bit_type *)
             CONCAT44(*(this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,iVar13);
        iVar2._M_current =
             (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data
             ._M_finish;
        if (iVar2._M_current ==
            (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<Arc,_std::allocator<Arc>_>::_M_realloc_insert<Arc>
                    (&this->A,iVar2,(Arc *)local_138);
        }
        else {
          (iVar2._M_current)->label =
               local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
          *(_Bit_type **)iVar2._M_current =
               local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          ppAVar1 = &(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
        iVar13 = iVar13 + 1;
        iVar14 = NodeSet::size(this_00);
      } while (iVar13 < iVar14);
    }
  }
  else {
    local_198._M_current = (int *)0x0;
    iStack_190._M_current = (int *)0x0;
    local_188 = (int *)0x0;
    local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)
         ((ulong)local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_ << 0x20);
    if (0 < (this->inst).nbtypes) {
      iVar13 = 0;
      do {
        if (iStack_190._M_current == local_188) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_198,iStack_190,(int *)local_138);
        }
        else {
          *iStack_190._M_current = iVar13;
          iStack_190._M_current = iStack_190._M_current + 1;
        }
        iVar13 = (int)local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1;
        local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p =
             (_Bit_type *)
             CONCAT44(local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,iVar13);
      } while (iVar13 < (this->inst).nbtypes);
    }
    iVar6._M_current = iStack_190._M_current;
    __first._M_current = local_198._M_current;
    if (local_198._M_current != iStack_190._M_current) {
      lVar24 = (long)iStack_190._M_current - (long)local_198._M_current;
      uVar15 = lVar24 >> 2;
      lVar26 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar26 == 0; lVar26 = lVar26 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Arcflow::finalize()::__0>>
                (local_198,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 iStack_190._M_current,(ulong)(((uint)lVar26 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:455:21)>
                  )this);
      if (lVar24 < 0x41) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<Arcflow::finalize()::__0>>
                  (__first,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           iVar6._M_current,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:455:21)>
                    )this);
      }
      else {
        __last._M_current = __first._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<Arcflow::finalize()::__0>>
                  (__first,__last,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:455:21)>
                    )this);
        for (; __last._M_current != iVar6._M_current; __last._M_current = __last._M_current + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<Arcflow::finalize()::__0>>
                    (__last,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:455:21)>
                             )this);
        }
      }
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->Ts,(long)(this->inst).nbtypes);
    if (0 < (this->inst).nbtypes) {
      lVar26 = 0;
      do {
        iVar13 = NodeSet::size(&this->NS);
        (this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_198._M_current[lVar26]] = iVar13 + (int)lVar26;
        lVar26 = lVar26 + 1;
      } while (lVar26 < (this->inst).nbtypes);
    }
    iVar13 = (this->inst).nbtypes;
    if (0 < iVar13) {
      lVar26 = 0;
      do {
        local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = this->LOSS;
        local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p =
             (_Bit_type *)
             CONCAT44(this->S,(this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar26]);
        iVar2._M_current =
             (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data
             ._M_finish;
        if (iVar2._M_current ==
            (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<Arc,_std::allocator<Arc>_>::_M_realloc_insert<Arc>
                    (&this->A,iVar2,(Arc *)local_138);
        }
        else {
          (iVar2._M_current)->label =
               local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
          *(_Bit_type **)iVar2._M_current =
               local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          ppAVar1 = &(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
        lVar26 = lVar26 + 1;
        iVar13 = (this->inst).nbtypes;
      } while (lVar26 < iVar13);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&local_150,(long)iVar13,(allocator_type *)local_138);
    iVar13 = (this->inst).nbtypes;
    if (0 < iVar13) {
      local_1b8 = 0;
      do {
        local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p =
             (_Bit_type *)
             ((ulong)local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
             0xffffffff00000000);
        if (0 < (this->inst).nbtypes) {
          uVar15 = 0;
          do {
            iVar13 = (int)uVar15;
            if (local_1b8 != uVar15) {
              pvVar3 = (this->inst).Ws.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar7 = pvVar3 + local_1b8;
              pvVar3 = pvVar3 + iVar13;
              uVar15 = (ulong)(this->inst).ndims;
              bVar27 = (long)uVar15 < 1;
              if (0 < (long)uVar15) {
                piVar21 = (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                piVar4 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                if (*piVar4 < *piVar21) goto LAB_0010ad96;
                uVar17 = 1;
                do {
                  uVar22 = uVar17;
                  if (uVar15 == uVar22) break;
                  uVar17 = uVar22 + 1;
                } while (piVar21[uVar22] <= piVar4[uVar22]);
                bVar27 = uVar15 <= uVar22;
              }
              if (bVar27) {
                piVar5 = (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                piVar16 = *(pointer *)
                           ((long)&(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data + 8);
                __n = (long)piVar16 - (long)piVar5;
                __s2 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
                sVar19 = (long)*(pointer *)
                                ((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data + 8) - (long)__s2;
                if (((__n != sVar19) ||
                    ((piVar16 != piVar5 &&
                     (local_160 = __s2, local_158 = piVar16, iVar14 = bcmp(piVar5,__s2,__n),
                     piVar16 = local_158, __s2 = local_160, iVar14 != 0)))) ||
                   (((long)local_1b8 < (long)iVar13 &&
                    ((__n == sVar19 &&
                     ((piVar16 == piVar5 || (iVar14 = bcmp(piVar5,__s2,__n), iVar14 == 0)))))))) {
                  this_01 = (vector<int,std::allocator<int>> *)
                            (local_150.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + local_1b8);
                  iVar6._M_current = *(int **)(this_01 + 8);
                  if (iVar6._M_current == *(int **)(this_01 + 0x10)) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              (this_01,iVar6,(int *)local_138);
                  }
                  else {
                    *iVar6._M_current = iVar13;
                    *(int **)(this_01 + 8) = iVar6._M_current + 1;
                  }
                }
              }
            }
LAB_0010ad96:
            uVar25 = (int)local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1;
            uVar15 = (ulong)uVar25;
            local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
            ._M_start.super__Bit_iterator_base._M_p =
                 (_Bit_type *)
                 CONCAT44(local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                          uVar25);
          } while ((int)uVar25 < (this->inst).nbtypes);
        }
        local_1b8 = local_1b8 + 1;
        iVar13 = (this->inst).nbtypes;
      } while ((long)local_1b8 < (long)iVar13);
    }
    local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_4_ = (uint)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start & 0xffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              (local_138,(long)iVar13,(bool *)&local_178,(allocator_type *)&local_1a4);
    for (iVar13 = 1; iVar14 = NodeSet::size(&this->NS), iVar13 < iVar14; iVar13 = iVar13 + 1) {
      NodeSet::get_label(&local_178,&this->NS,iVar13);
      iVar14 = (this->inst).nbtypes;
      uVar15 = (ulong)iVar14;
      if (0 < (long)uVar15) {
        uVar25 = (this->inst).ndims;
        pvVar7 = (this->inst).Ws.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar17 = 0;
        do {
          bVar27 = (int)uVar25 < 1;
          if (0 < (int)uVar25) {
            piVar21 = pvVar7[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (*piVar21 <
                *(int *)CONCAT44(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 (uint)local_178.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start)) {
              bVar27 = false;
            }
            else {
              uVar22 = 1;
              do {
                uVar23 = uVar22;
                if (uVar25 == uVar23) break;
                uVar22 = uVar23 + 1;
              } while (((int *)CONCAT44(local_178.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                                        (uint)local_178.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start))[uVar23] <=
                       piVar21[uVar23]);
              bVar27 = uVar25 <= uVar23;
            }
          }
          uVar22 = uVar17 >> 6;
          uVar23 = 1L << ((byte)uVar17 & 0x3f);
          if (bVar27) {
            uVar23 = uVar23 | local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                              [uVar22];
          }
          else {
            uVar23 = ~uVar23 & local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                               [uVar22];
          }
          local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar22] = uVar23;
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar15);
      }
      if (0 < iVar14) {
        uVar17 = 0;
        do {
          if ((local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar17 >> 6] >>
               (uVar17 & 0x3f) & 1) != 0) {
            piVar4 = local_150.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar17].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish;
            for (piVar21 = local_150.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar17].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start; piVar21 != piVar4;
                piVar21 = piVar21 + 1) {
              uVar23 = (ulong)*piVar21;
              uVar22 = uVar23 + 0x3f;
              if (-1 < (long)uVar23) {
                uVar22 = uVar23;
              }
              bVar11 = (byte)*piVar21 & 0x3f;
              local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
              [((long)uVar22 >> 6) +
               ((ulong)((uVar23 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                   local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar22 >> 6) +
                    ((ulong)((uVar23 & 0x800000000000003f) < 0x8000000000000001) - 1)] &
                   (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
            }
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar15);
      }
      if (0 < (this->inst).nbtypes) {
        uVar15 = 0;
        do {
          if ((local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar15 >> 6] >>
               (uVar15 & 0x3f) & 1) != 0) {
            local_1a4.label = this->LOSS;
            local_1a4.v = (this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar15];
            iVar2._M_current =
                 (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_1a4.u = iVar13;
            if (iVar2._M_current ==
                (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Arc,_std::allocator<Arc>_>::_M_realloc_insert<Arc>
                        (&this->A,iVar2,&local_1a4);
            }
            else {
              (iVar2._M_current)->label = local_1a4.label;
              (iVar2._M_current)->u = iVar13;
              (iVar2._M_current)->v = local_1a4.v;
              ppAVar1 = &(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
          }
          uVar15 = uVar15 + 1;
        } while ((long)uVar15 < (long)(this->inst).nbtypes);
      }
      if ((void *)CONCAT44(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           (uint)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_178.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)local_178.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start));
      }
    }
    uVar25 = (this->inst).nbtypes;
    uVar15 = (ulong)uVar25;
    if (0 < (int)uVar25) {
      lVar26 = 0;
      do {
        std::vector<bool,_std::allocator<bool>_>::_M_fill_assign(local_138,(long)(int)uVar15,false);
        piVar4 = local_150.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar26].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        piVar21 = local_150.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar26].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        for (piVar20 = piVar21; piVar12 = piVar21, piVar20 != piVar4; piVar20 = piVar20 + 1) {
          uVar17 = (ulong)*piVar20;
          uVar15 = uVar17 + 0x3f;
          if (-1 < (long)uVar17) {
            uVar15 = uVar17;
          }
          local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [((long)uVar15 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)]
               = local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar15 >> 6) +
                  ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                 1L << ((byte)*piVar20 & 0x3f);
        }
        for (; piVar12 != piVar4; piVar12 = piVar12 + 1) {
          uVar17 = (ulong)*piVar12;
          uVar15 = uVar17 + 0x3f;
          if (-1 < (long)uVar17) {
            uVar15 = uVar17;
          }
          if ((local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar15 >> 6) +
                ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
               (uVar17 & 0x3f) & 1) != 0) {
            piVar8 = local_150.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar17].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish;
            for (piVar20 = local_150.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar17].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start; piVar20 != piVar8;
                piVar20 = piVar20 + 1) {
              uVar17 = (ulong)*piVar20;
              uVar15 = uVar17 + 0x3f;
              if (-1 < (long)uVar17) {
                uVar15 = uVar17;
              }
              bVar11 = (byte)*piVar20 & 0x3f;
              local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
              [((long)uVar15 >> 6) +
               ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                   local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar15 >> 6) +
                    ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] &
                   (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
            }
          }
        }
        for (; piVar21 != piVar4; piVar21 = piVar21 + 1) {
          uVar17 = (ulong)*piVar21;
          uVar15 = uVar17 + 0x3f;
          if (-1 < (long)uVar17) {
            uVar15 = uVar17;
          }
          if ((local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar15 >> 6) +
                ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
               (uVar17 & 0x3f) & 1) != 0) {
            piVar5 = (this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish._0_4_ = this->LOSS;
            local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ = piVar5[lVar26];
            local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._4_4_ = piVar5[uVar17];
            iVar2._M_current =
                 (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Arc,_std::allocator<Arc>_>::_M_realloc_insert<Arc>
                        (&this->A,iVar2,(Arc *)&local_178);
            }
            else {
              (iVar2._M_current)->label =
                   (int)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              (iVar2._M_current)->u =
                   (uint)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              (iVar2._M_current)->v =
                   local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_;
              ppAVar1 = &(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
          }
        }
        lVar26 = lVar26 + 1;
        uVar15 = (ulong)(this->inst).nbtypes;
      } while (lVar26 < (long)uVar15);
    }
    if (local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_150);
    if (local_198._M_current != (int *)0x0) {
      operator_delete(local_198._M_current);
    }
  }
  reduce_redundancy(this);
  iVar13 = NodeSet::size(&this->NS);
  pAVar18 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
            _M_start;
  pAVar9 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  this->NV = (int)((ulong)((long)(this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2) + iVar13;
  this->NA = (int)((ulong)((long)pAVar9 - (long)pAVar18) >> 2) * -0x55555555;
  if (pAVar9 != pAVar18) {
    iVar13 = this->LOSS;
    pIVar10 = (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (pAVar18->label != iVar13) {
        pAVar18->label = pIVar10[pAVar18->label].id;
      }
      pAVar18 = pAVar18 + 1;
    } while (pAVar18 != pAVar9);
  }
  this->ready = true;
  return;
}

Assistant:

void Arcflow::finalize() {
	throw_assert(ready == false);
	if (inst.nbtypes == 1) {
		S = 0;
		Ts.assign({NS.size()});
		A.push_back(Arc(Ts[0], S, LOSS));
		for (int i = 1; i < static_cast<int>(NS.size()); i++) {
			A.push_back(Arc(i, Ts[0], LOSS));
		}
	} else {
		S = 0;
		std::vector<int> torder;
		for (int i = 0; i < inst.nbtypes; i++) {
			torder.push_back(i);
		}
		sort(all(torder), [this](int a, int b) {
			return this->inst.Ws[a] < this->inst.Ws[b];
		});
		Ts.resize(inst.nbtypes);
		for (int i = 0; i < inst.nbtypes; i++) {
			Ts[torder[i]] = NS.size() + i;
		}
		for (int i = 0; i < inst.nbtypes; i++) {
			A.push_back(Arc(Ts[i], S, LOSS));
		}

		std::vector<std::vector<int>> bigger_than(inst.nbtypes);
		for (int t1 = 0; t1 < inst.nbtypes; t1++) {
			for (int t2 = 0; t2 < inst.nbtypes; t2++) {
				if (t1 != t2 && is_valid(inst.Ws[t1], inst.Ws[t2])) {
					if (inst.Ws[t1] != inst.Ws[t2] ||
						(t1 < t2 && inst.Ws[t1] == inst.Ws[t2])) {
						bigger_than[t1].push_back(t2);
					}
				}
			}
		}

		std::vector<bool> valid_tgts(inst.nbtypes);
		for (int i = 1; i < static_cast<int>(NS.size()); i++) {
			const std::vector<int> &u = NS.get_label(i);
			for (int t = 0; t < inst.nbtypes; t++) {
				valid_tgts[t] = is_valid(u, inst.Ws[t]);
			}
			for (int t1 = 0; t1 < inst.nbtypes; t1++) {
				if (valid_tgts[t1]) {
					for (int t2 : bigger_than[t1]) {
						valid_tgts[t2] = false;
					}
				}
			}
			for (int t = 0; t < inst.nbtypes; t++) {
				if (valid_tgts[t]) {
					A.push_back(Arc(i, Ts[t], LOSS));
				}
			}
		}

		for (int t1 = 0; t1 < inst.nbtypes; t1++) {
			valid_tgts.assign(inst.nbtypes, false);
			for (int t2 : bigger_than[t1]) {
				valid_tgts[t2] = true;
			}
			for (int t2 : bigger_than[t1]) {
				if (valid_tgts[t2]) {
					for (int t3 : bigger_than[t2]) {
						valid_tgts[t3] = false;
					}
				}
			}
			for (int t2 : bigger_than[t1]) {
				if (valid_tgts[t2]) {
					A.push_back(Arc(Ts[t1], Ts[t2], LOSS));
				}
			}
		}
	}
	reduce_redundancy();
	NV = NS.size() + Ts.size();
	NA = A.size();
	for (Arc &a : A) {
		if (a.label != LOSS) {
			a.label = sitems[a.label].id;
		}
	}
	ready = true;
}